

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult GenValidUsageNextXrRequestWorldMeshAsyncML
                   (XrWorldMeshDetectorML detector,XrWorldMeshGetInfoML *getInfo,
                   XrWorldMeshBufferML *buffer,XrFutureEXT *future)

{
  XrResult XVar1;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar2;
  
  pVar2 = HandleInfo<XrWorldMeshDetectorML_T_*>::getWithInstanceInfo
                    (&g_worldmeshdetectorml_info,detector);
  XVar1 = (*(pVar2.second)->dispatch_table->RequestWorldMeshAsyncML)(detector,getInfo,buffer,future)
  ;
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrRequestWorldMeshAsyncML(
    XrWorldMeshDetectorML detector,
    const XrWorldMeshGetInfoML* getInfo,
    XrWorldMeshBufferML* buffer,
    XrFutureEXT* future) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_worldmeshdetectorml_info.getWithInstanceInfo(detector);
        GenValidUsageXrHandleInfo *gen_worldmeshdetectorml_info = info_with_instance.first;
        (void)gen_worldmeshdetectorml_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->RequestWorldMeshAsyncML(detector, getInfo, buffer, future);
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}